

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> * __thiscall
cfd::core::DescriptorScriptReference::GenerateAddresses
          (vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *__return_storage_ptr__,
          DescriptorScriptReference *this,NetType net_type)

{
  pointer pDVar1;
  pointer pDVar2;
  NetType local_1ac;
  Address local_1a8;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ac = net_type;
  if (this->script_type_ - kDescriptorScriptMulti < 2) {
    pDVar1 = (this->keys_).
             super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar2 = (this->keys_).
                  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  ._M_impl.super__Vector_impl_data._M_start; pDVar2 != pDVar1; pDVar2 = pDVar2 + 1)
    {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pDVar2->pubkey_);
      ::std::vector<cfd::core::Address,std::allocator<cfd::core::Address>>::
      emplace_back<cfd::core::NetType&,cfd::core::Pubkey,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                ((vector<cfd::core::Address,std::allocator<cfd::core::Address>> *)
                 __return_storage_ptr__,&local_1ac,(Pubkey *)&local_1a8,&this->addr_prefixes_);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8);
    }
  }
  else {
    GenerateAddress(&local_1a8,this,net_type);
    ::std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::
    emplace_back<cfd::core::Address>(__return_storage_ptr__,&local_1a8);
    core::Address::~Address(&local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Address> DescriptorScriptReference::GenerateAddresses(
    NetType net_type) const {
  std::vector<Address> result;
  if ((script_type_ == DescriptorScriptType::kDescriptorScriptMulti) ||
      (script_type_ == DescriptorScriptType::kDescriptorScriptSortedMulti)) {
    for (const auto& key : keys_) {
      result.emplace_back(net_type, key.GetPubkey(), addr_prefixes_);
    }
  } else {
    result.push_back(GenerateAddress(net_type));
  }
  return result;
}